

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  ssize_t sStack_38;
  CURLcode result;
  ssize_t written;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  Curl_easy *data_local;
  
  sStack_38 = 0;
  written = (ssize_t)n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = data;
  _Var1 = Curl_is_in_callback(data);
  if (_Var1) {
    data_local._4_4_ = CURLE_RECURSIVE_API_CALL;
  }
  else {
    data_local._4_4_ =
         Curl_senddata((Curl_easy *)buffer_local,(void *)buflen_local,(size_t)n_local,
                       &stack0xffffffffffffffc8);
    *(ssize_t *)written = sStack_38;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  ssize_t written = 0;
  CURLcode result;
  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = Curl_senddata(data, buffer, buflen, &written);
  *n = (size_t)written;
  return result;
}